

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinSerializer<std::set<int,_std::less<int>,_std::allocator<int>_>,_void>::
     serialize<binlog::detail::QueueWriter>
               (set<int,_std::less<int>,_std::allocator<int>_> *s,QueueWriter *ostream)

{
  *(int *)ostream->_writePos = (int)(s->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  ostream->_writePos = ostream->_writePos + 4;
  serialize_elems<binlog::detail::QueueWriter>();
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }